

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O3

void __thiscall kj::_::Mutex::lockWhen(Mutex *this,Predicate *predicate)

{
  char cVar1;
  Waiter *next;
  Waiter *next_1;
  Maybe<kj::_::Mutex::Waiter_&> **ppMVar2;
  Waiter waiter;
  Waiter local_38;
  
  lock(this,EXCLUSIVE);
  local_38.next.ptr = (Waiter *)0x0;
  local_38.prev = this->waitersTail;
  local_38.futex = 0;
  (local_38.prev)->ptr = &local_38;
  this->waitersTail = &local_38.next;
  local_38.predicate = predicate;
  cVar1 = (*(code *)**(undefined8 **)predicate)(predicate);
  if (cVar1 == '\0') {
    unlock(this,EXCLUSIVE);
    if (local_38.futex == 0) {
      do {
        syscall(0xca,&local_38.futex,0x80,0,0,0,0);
      } while (local_38.futex == 0);
    }
  }
  (local_38.prev)->ptr = local_38.next.ptr;
  ppMVar2 = &(local_38.next.ptr)->prev;
  if (local_38.next.ptr == (Waiter *)0x0) {
    ppMVar2 = &this->waitersTail;
  }
  *ppMVar2 = local_38.prev;
  return;
}

Assistant:

void Mutex::lockWhen(Predicate& predicate) {
  lock(EXCLUSIVE);

  // Add waiter to list.
  Waiter waiter { nullptr, waitersTail, predicate, 0 };
  *waitersTail = waiter;
  waitersTail = &waiter.next;

  KJ_DEFER({
    // Remove from list.
    *waiter.prev = waiter.next;
    KJ_IF_MAYBE(next, waiter.next) {
      next->prev = waiter.prev;
    } else {
      KJ_DASSERT(waitersTail == &waiter.next);
      waitersTail = waiter.prev;
    }
  });

  if (!predicate.check()) {
    unlock(EXCLUSIVE);

    // Wait for someone to set out futex to 1.
    while (__atomic_load_n(&waiter.futex, __ATOMIC_ACQUIRE) == 0) {
      syscall(SYS_futex, &waiter.futex, FUTEX_WAIT_PRIVATE, 0, NULL, NULL, 0);
    }

    // Ownership of an exclusive lock was transferred to us. We can continue.
#ifdef KJ_DEBUG
    assertLockedByCaller(EXCLUSIVE);
#endif
  }
}